

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 UVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  int iVar4;
  uint uVar5;
  U32 UVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  U32 UVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  size_t sVar21;
  size_t sVar22;
  long lVar23;
  BYTE *pBVar24;
  BYTE *dst;
  BYTE *pBVar25;
  ulong uVar26;
  bool bVar27;
  BYTE *local_5c8;
  BYTE *local_5b8;
  BYTE *local_588;
  BYTE *local_570;
  BYTE *local_560;
  BYTE *local_558;
  uint local_550;
  uint local_54c;
  uint local_504;
  uint local_500;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  size_t mLength_1;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  size_t rLength_1;
  BYTE *repMatchEnd;
  BYTE *repMatch_1;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t h;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *dictBase;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff;
  size_t rLength;
  size_t step;
  U32 offcode;
  BYTE *match1;
  BYTE *match0;
  BYTE *repMatch;
  U32 matchIndex1;
  U32 matchIndex0;
  U32 current1;
  U32 current0;
  U32 val1;
  size_t h1;
  U32 val0;
  size_t h0;
  BYTE *ip2;
  size_t mLength;
  U32 maxRep;
  U32 offsetSaved;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  U32 prefixStartIndex_1;
  U32 validStartIndex;
  U32 maxDistance;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart_1;
  BYTE *base_1;
  size_t stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  
  pUVar2 = ms->hashTable;
  UVar1 = (ms->cParams).hashLog;
  uVar5 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
  pBVar3 = (ms->window).base;
  pBVar20 = (ms->window).dictBase;
  iVar4 = (int)pBVar3;
  UVar6 = ZSTD_getLowestMatchIndex(ms,((int)src - iVar4) + (int)srcSize,(ms->cParams).windowLog);
  local_500 = (ms->window).dictLimit;
  if (local_500 < UVar6) {
    local_500 = UVar6;
  }
  pBVar16 = pBVar3 + local_500;
  pBVar17 = pBVar20 + local_500;
  pBVar18 = (BYTE *)((long)src + srcSize);
  pBVar19 = pBVar18 + -8;
  h._4_4_ = *rep;
  h._0_4_ = rep[1];
  _lowLimit = (BYTE *)src;
  anchor = (BYTE *)src;
  if (local_500 == UVar6) {
    pUVar2 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar5 = (ms->cParams).targetLength;
    uVar14 = (ms->cParams).targetLength;
    pBVar3 = (ms->window).base;
    iVar4 = (int)pBVar3;
    iVar7 = ((int)src - iVar4) + (int)srcSize;
    uVar8 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_504 = (ms->window).dictLimit;
    if (uVar8 < iVar7 - local_504) {
      local_504 = iVar7 - uVar8;
    }
    pBVar20 = pBVar3 + local_504;
    pBVar16 = (BYTE *)((long)src + srcSize);
    pBVar17 = pBVar16 + -8;
    uVar8 = *rep;
    uVar13 = rep[1];
    mLength._4_4_ = 0;
    ip1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar20));
    anchor_1 = ip1 + 1;
    uVar9 = (int)ip1 - (int)pBVar20;
    maxRep = uVar13;
    if (uVar9 < uVar13) {
      maxRep = 0;
      mLength._4_4_ = uVar13;
    }
    offsetSaved = uVar8;
    _maxDistance = (BYTE *)src;
    if (uVar9 < uVar8) {
      offsetSaved = 0;
      mLength._4_4_ = uVar8;
    }
    while (anchor_1 < pBVar17) {
      pBVar18 = ip1 + 2;
      sVar21 = ZSTD_hashPtr(ip1,UVar1,mls);
      UVar6 = MEM_read32(ip1);
      sVar22 = ZSTD_hashPtr(anchor_1,UVar1,mls);
      UVar10 = MEM_read32(anchor_1);
      uVar9 = (int)ip1 - iVar4;
      uVar8 = pUVar2[sVar21];
      uVar13 = pUVar2[sVar22];
      pBVar19 = pBVar18 + -(ulong)offsetSaved;
      match1 = pBVar3 + uVar8;
      pUVar2[sVar21] = uVar9;
      pUVar2[sVar22] = (int)anchor_1 - iVar4;
      if (ip1 + 1 != anchor_1) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      UVar11 = MEM_read32(pBVar19);
      UVar12 = MEM_read32(pBVar18);
      if (offsetSaved == 0 || UVar11 != UVar12) {
        if ((local_504 < uVar8) && (UVar11 = MEM_read32(match1), UVar11 == UVar6)) {
LAB_001c2842:
          maxRep = offsetSaved;
          offsetSaved = (int)ip1 - (int)match1;
          step._4_4_ = offsetSaved + 2;
          ip2 = (BYTE *)0x0;
          while( true ) {
            bVar27 = false;
            if (_maxDistance < ip1 && pBVar20 < match1) {
              bVar27 = ip1[-1] == match1[-1];
            }
            if (!bVar27) break;
            ip1 = ip1 + -1;
            match1 = match1 + -1;
            ip2 = ip2 + 1;
          }
          goto LAB_001c2924;
        }
        if ((local_504 < uVar13) && (UVar6 = MEM_read32(pBVar3 + uVar13), UVar6 == UVar10)) {
          ip1 = anchor_1;
          match1 = pBVar3 + uVar13;
          goto LAB_001c2842;
        }
        uVar26 = ((ulong)((long)ip1 - (long)_maxDistance) >> 7) +
                 (ulong)(uVar5 + ((uVar14 != 0 ^ 0xffU) & 1) + 1);
        if (uVar26 < 2) {
          __assert_fail("step >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d6a,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        ip1 = ip1 + uVar26;
        anchor_1 = anchor_1 + uVar26;
      }
      else {
        ip2 = (BYTE *)(long)(int)(uint)(ip1[1] == pBVar19[-1]);
        ip1 = pBVar18 + -(long)ip2;
        match1 = pBVar19 + -(long)ip2;
        step._4_4_ = 0;
LAB_001c2924:
        sVar21 = ZSTD_count(ip1 + (long)ip2 + 4,match1 + (long)ip2 + 4,pBVar16);
        pBVar18 = ip2 + sVar21 + 4;
        uVar26 = (long)ip1 - (long)_maxDistance;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar26) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar16 < _maxDistance + uVar26) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar16 + -0x20 < _maxDistance + uVar26) {
          ZSTD_safecopyLiterals(seqStore->lit,_maxDistance,_maxDistance + uVar26,pBVar16 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_maxDistance);
          if (0x10 < uVar26) {
            pBVar19 = seqStore->lit;
            pBVar24 = pBVar19 + 0x10;
            lVar23 = (long)pBVar24 - (long)(_maxDistance + 0x10);
            if (lVar23 < 8 && -0x10 < lVar23) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar23 < 0x10 && -0x10 < lVar23) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar24,_maxDistance + 0x10);
            while (pBVar19 = pBVar19 + 0x20, pBVar19 < pBVar24 + (uVar26 - 0x10)) {
              op = _maxDistance + 0x20;
              ZSTD_copy16(pBVar19,op);
              ZSTD_copy16(pBVar19 + 0x10,_maxDistance + 0x30);
              _maxDistance = op;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar26;
        if (0xffff < uVar26) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar26;
        seqStore->sequences->offset = step._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar18 + -3) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar18 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        _maxDistance = pBVar18 + (long)ip1;
        anchor_1 = _maxDistance + 1;
        ip1 = _maxDistance;
        if (_maxDistance <= pBVar17) {
          if (pBVar3 + (ulong)uVar9 + 2 <= src) {
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d84,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          sVar21 = ZSTD_hashPtr(pBVar3 + (ulong)uVar9 + 2,UVar1,mls);
          pUVar2[sVar21] = uVar9 + 2;
          sVar21 = ZSTD_hashPtr(_maxDistance + -2,UVar1,mls);
          pUVar2[sVar21] = ((int)_maxDistance + -2) - iVar4;
          ip1 = _maxDistance;
          while( true ) {
            UVar6 = maxRep;
            bVar27 = false;
            if (ip1 <= pBVar17 && maxRep != 0) {
              UVar10 = MEM_read32(ip1);
              UVar11 = MEM_read32(ip1 + -(ulong)maxRep);
              bVar27 = UVar10 == UVar11;
            }
            _maxDistance = ip1;
            if (!bVar27) break;
            sVar21 = ZSTD_count(ip1 + 4,ip1 + (4 - (ulong)maxRep),pBVar16);
            maxRep = offsetSaved;
            offsetSaved = UVar6;
            sVar22 = ZSTD_hashPtr(ip1,UVar1,mls);
            pUVar2[sVar22] = (int)ip1 - iVar4;
            anchor_1 = ip1 + sVar21 + 4 + 1;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar16 < ip1) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar16 + -0x20 < ip1) {
              ZSTD_safecopyLiterals(seqStore->lit,ip1,ip1,pBVar16 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,ip1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar21 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            ip1 = ip1 + sVar21 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_54c = mLength._4_4_;
    }
    else {
      local_54c = offsetSaved;
    }
    *rep = local_54c;
    if (maxRep == 0) {
      local_550 = mLength._4_4_;
    }
    else {
      local_550 = maxRep;
    }
    rep[1] = local_550;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)_maxDistance);
  }
  else {
LAB_001c36bd:
    if (anchor < pBVar19) {
      sVar21 = ZSTD_hashPtr(anchor,UVar1,mls);
      uVar14 = pUVar2[sVar21];
      local_558 = pBVar3;
      if (uVar14 < local_500) {
        local_558 = pBVar20;
      }
      _repIndex = local_558 + uVar14;
      uVar8 = (int)anchor - iVar4;
      uVar13 = (uVar8 + 1) - h._4_4_;
      local_560 = pBVar3;
      if (uVar13 < local_500) {
        local_560 = pBVar20;
      }
      pUVar2[sVar21] = uVar8;
      if (uVar8 + 1 < h._4_4_) {
        __assert_fail("offset_1 <= current +1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3e88,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      if ((local_500 - 1) - uVar13 < 3 || uVar13 <= UVar6) {
LAB_001c3ef3:
        if (UVar6 <= uVar14) {
          UVar10 = MEM_read32(_repIndex);
          UVar11 = MEM_read32(anchor);
          if (UVar10 == UVar11) {
            local_588 = pBVar16;
            pBVar24 = pBVar18;
            if (uVar14 < local_500) {
              local_588 = pBVar20 + UVar6;
              pBVar24 = pBVar17;
            }
            sVar21 = ZSTD_count_2segments(anchor + 4,_repIndex + 4,pBVar18,pBVar24,pBVar16);
            _repIndex2 = sVar21 + 4;
            while( true ) {
              bVar27 = false;
              if (_lowLimit < anchor && local_588 < _repIndex) {
                bVar27 = anchor[-1] == _repIndex[-1];
              }
              if (!bVar27) break;
              anchor = anchor + -1;
              _repIndex = _repIndex + -1;
              _repIndex2 = _repIndex2 + 1;
            }
            h._0_4_ = h._4_4_;
            uVar26 = (long)anchor - (long)_lowLimit;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar26) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 < _lowLimit + uVar26) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 + -0x20 < _lowLimit + uVar26) {
              ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit + uVar26,pBVar18 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowLimit);
              if (0x10 < uVar26) {
                pBVar24 = seqStore->lit;
                pBVar25 = pBVar24 + 0x10;
                lVar23 = (long)pBVar25 - (long)(_lowLimit + 0x10);
                if (lVar23 < 8 && -0x10 < lVar23) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar23 < 0x10 && -0x10 < lVar23) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar25,_lowLimit + 0x10);
                while (pBVar24 = pBVar24 + 0x20, pBVar24 < pBVar25 + (uVar26 - 0x10)) {
                  op_3 = _lowLimit + 0x20;
                  ZSTD_copy16(pBVar24,op_3);
                  ZSTD_copy16(pBVar24 + 0x10,_lowLimit + 0x30);
                  _lowLimit = op_3;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar26;
            seqStore->sequences->offset = (uVar8 - uVar14) + 3;
            if (0xffff < _repIndex2 - 3U) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(_repIndex2 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            anchor = anchor + _repIndex2;
            h._4_4_ = uVar8 - uVar14;
            goto LAB_001c46de;
          }
        }
        if (uVar5 == 0) {
          __assert_fail("stepSize >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3e95,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        anchor = anchor + ((long)anchor - (long)_lowLimit >> 8) + (ulong)uVar5;
      }
      else {
        UVar10 = MEM_read32(local_560 + uVar13);
        UVar11 = MEM_read32(anchor + 1);
        if (UVar10 != UVar11) goto LAB_001c3ef3;
        local_570 = pBVar18;
        if (uVar13 < local_500) {
          local_570 = pBVar17;
        }
        sVar21 = ZSTD_count_2segments(anchor + 5,local_560 + uVar13 + 4,pBVar18,local_570,pBVar16);
        pBVar24 = anchor + (1 - (long)_lowLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + (long)pBVar24) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar18 < _lowLimit + (long)pBVar24) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar18 + -0x20 < _lowLimit + (long)pBVar24) {
          ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit + (long)pBVar24,pBVar18 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowLimit);
          if ((BYTE *)0x10 < pBVar24) {
            pBVar25 = seqStore->lit;
            dst = pBVar25 + 0x10;
            lVar23 = (long)dst - (long)(_lowLimit + 0x10);
            if (lVar23 < 8 && -0x10 < lVar23) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar23 < 0x10 && -0x10 < lVar23) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(dst,_lowLimit + 0x10);
            while (pBVar25 = pBVar25 + 0x20, pBVar25 < dst + (long)(pBVar24 + -0x10)) {
              op_2 = _lowLimit + 0x20;
              ZSTD_copy16(pBVar25,op_2);
              ZSTD_copy16(pBVar25 + 0x10,_lowLimit + 0x30);
              _lowLimit = op_2;
            }
          }
        }
        seqStore->lit = seqStore->lit + (long)pBVar24;
        if ((BYTE *)0xffff < pBVar24) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)pBVar24;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
        anchor = anchor + sVar21 + 5;
LAB_001c46de:
        _lowLimit = anchor;
        if (anchor <= pBVar19) {
          sVar21 = ZSTD_hashPtr(pBVar3 + (ulong)uVar8 + 2,UVar1,mls);
          pUVar2[sVar21] = uVar8 + 2;
          sVar21 = ZSTD_hashPtr(anchor + -2,UVar1,mls);
          pUVar2[sVar21] = ((int)anchor + -2) - iVar4;
          for (; UVar10 = (U32)h, _lowLimit = anchor, anchor <= pBVar19;
              anchor = anchor + sVar21 + 4) {
            UVar11 = (int)anchor - iVar4;
            uVar14 = UVar11 - (U32)h;
            if (uVar14 < local_500) {
              local_5b8 = pBVar20 + uVar14;
            }
            else {
              local_5b8 = pBVar3 + uVar14;
            }
            if ((local_500 - 1) - uVar14 < 3 || uVar14 <= UVar6) break;
            UVar12 = MEM_read32(local_5b8);
            UVar15 = MEM_read32(anchor);
            if (UVar12 != UVar15) break;
            local_5c8 = pBVar18;
            if (uVar14 < local_500) {
              local_5c8 = pBVar17;
            }
            sVar21 = ZSTD_count_2segments(anchor + 4,local_5b8 + 4,pBVar18,local_5c8,pBVar16);
            h._0_4_ = h._4_4_;
            h._4_4_ = UVar10;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar18 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar21 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar22 = ZSTD_hashPtr(anchor,UVar1,mls);
            pUVar2[sVar22] = UVar11;
          }
        }
      }
      goto LAB_001c36bd;
    }
    *rep = h._4_4_;
    rep[1] = (U32)h;
    ms_local = (ZSTD_matchState_t *)(pBVar18 + -(long)_lowLimit);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic");

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = current - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}